

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon_label.c
# Opt level: O0

int count_mora_in_accent_phrase(JPCommonLabelMora *m)

{
  JPCommonLabelMora *index;
  int i;
  JPCommonLabelMora *m_local;
  
  i = 0;
  for (index = m->up->up->head->head;
      (index != (JPCommonLabelMora *)0x0 && (i = i + 1, index != m->up->up->tail->tail));
      index = index->next) {
  }
  return i;
}

Assistant:

static int count_mora_in_accent_phrase(JPCommonLabelMora * m)
{
   int i;
   JPCommonLabelMora *index;

   for (i = 0, index = m->up->up->head->head; index != NULL; index = index->next) {
      i++;
      if (index == m->up->up->tail->tail)
         break;
   }
   return i;
}